

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::parseScaleOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *p;
  DecNum *pDVar3;
  char *offset;
  UnicodeString *s;
  StringPiece str;
  DecNum *local_158;
  Scale local_140;
  undefined1 local_128 [12];
  undefined1 local_111;
  DecNum *local_110;
  LocalPointerBase<icu_63::number::impl::DecNum> local_108;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  UnicodeString local_f0;
  ConstChar16Ptr local_b0;
  UnicodeString local_a8;
  UErrorCode local_64;
  undefined1 local_60 [4];
  UErrorCode conversionStatus;
  CharString buffer;
  UErrorCode *status_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  buffer._56_8_ = status;
  CharString::CharString((CharString *)local_60);
  local_64 = U_ZERO_ERROR;
  numparse::impl::StringSegment::toTempUnicodeString(&local_f0,segment);
  p = UnicodeString::getBuffer(&local_f0);
  ConstChar16Ptr::ConstChar16Ptr(&local_b0,p);
  iVar2 = numparse::impl::StringSegment::length(segment);
  UnicodeString::UnicodeString(&local_a8,'\0',&local_b0,iVar2);
  s = &local_a8;
  CharString::appendInvariantChars((CharString *)local_60,s,&local_64);
  UnicodeString::~UnicodeString(&local_a8);
  ConstChar16Ptr::~ConstChar16Ptr(&local_b0);
  UnicodeString::~UnicodeString(&local_f0);
  if (local_64 == U_INVARIANT_CONVERSION_ERROR) {
    *(undefined4 *)buffer._56_8_ = 0x10113;
    decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._0_4_ = 1;
  }
  else {
    UVar1 = ::U_FAILURE(local_64);
    if (UVar1 == '\0') {
      pDVar3 = (DecNum *)UMemory::operator_new((UMemory *)0x60,(size_t)s);
      local_111 = 0;
      local_158 = (DecNum *)0x0;
      if (pDVar3 != (DecNum *)0x0) {
        local_111 = 1;
        local_110 = pDVar3;
        DecNum::DecNum(pDVar3);
        local_158 = pDVar3;
      }
      LocalPointer<icu_63::number::impl::DecNum>::LocalPointer
                ((LocalPointer<icu_63::number::impl::DecNum> *)&local_108,local_158,
                 (UErrorCode *)buffer._56_8_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)buffer._56_8_);
      if (UVar1 == '\0') {
        pDVar3 = LocalPointerBase<icu_63::number::impl::DecNum>::operator->(&local_108);
        offset = CharString::data((CharString *)local_60);
        iVar2 = CharString::length((CharString *)local_60);
        StringPiece::StringPiece((StringPiece *)local_128,offset,iVar2);
        str._12_4_ = 0;
        str.ptr_ = (char *)local_128._0_8_;
        str.length_ = local_128._8_4_;
        DecNum::setTo(pDVar3,str,(UErrorCode *)buffer._56_8_);
        UVar1 = ::U_FAILURE(*(UErrorCode *)buffer._56_8_);
        if (UVar1 == '\0') {
          pDVar3 = LocalPointerBase<icu_63::number::impl::DecNum>::orphan(&local_108);
          Scale::Scale(&local_140,0,pDVar3);
          Scale::operator=(&macros->scale,&local_140);
          Scale::~Scale(&local_140);
          decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._0_4_ = 0;
        }
        else {
          *(undefined4 *)buffer._56_8_ = 0x10113;
          decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._0_4_ = 1;
        }
      }
      else {
        decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._0_4_ = 1;
      }
      LocalPointer<icu_63::number::impl::DecNum>::~LocalPointer
                ((LocalPointer<icu_63::number::impl::DecNum> *)&local_108);
    }
    else {
      *(UErrorCode *)buffer._56_8_ = local_64;
      decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._0_4_ = 1;
    }
  }
  CharString::~CharString((CharString *)local_60);
  return;
}

Assistant:

void blueprint_helpers::parseScaleOption(const StringSegment& segment, MacroProps& macros,
                                              UErrorCode& status) {
    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString buffer;
    SKELETON_UCHAR_TO_CHAR(buffer, segment.toTempUnicodeString(), 0, segment.length(), status);

    LocalPointer<DecNum> decnum(new DecNum(), status);
    if (U_FAILURE(status)) { return; }
    decnum->setTo({buffer.data(), buffer.length()}, status);
    if (U_FAILURE(status)) {
        // This is a skeleton syntax error; don't let the low-level decnum error bubble up
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }

    // NOTE: The constructor will optimize the decnum for us if possible.
    macros.scale = {0, decnum.orphan()};
}